

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.cc
# Opt level: O2

void __thiscall Cleaner::DoCleanTarget(Cleaner *this,Node *target)

{
  Edge *this_00;
  bool bVar1;
  size_type sVar2;
  pointer ppNVar3;
  Node *next;
  Node *local_38;
  Node *local_30;
  
  this_00 = target->in_edge_;
  local_30 = target;
  if (this_00 != (Edge *)0x0) {
    bVar1 = Edge::is_phony(this_00);
    if (!bVar1) {
      Remove(this,&target->path_);
      RemoveEdgeFiles(this,this_00);
    }
    for (ppNVar3 = (this_00->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        ppNVar3 !=
        (this_00->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppNVar3 = ppNVar3 + 1) {
      local_38 = *ppNVar3;
      sVar2 = std::set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_>::count
                        (&this->cleaned_,&local_38);
      if (sVar2 == 0) {
        DoCleanTarget(this,local_38);
      }
    }
  }
  std::_Rb_tree<Node*,Node*,std::_Identity<Node*>,std::less<Node*>,std::allocator<Node*>>::
  _M_insert_unique<Node*const&>
            ((_Rb_tree<Node*,Node*,std::_Identity<Node*>,std::less<Node*>,std::allocator<Node*>> *)
             &this->cleaned_,&local_30);
  return;
}

Assistant:

void Cleaner::DoCleanTarget(Node* target) {
  if (Edge* e = target->in_edge()) {
    // Do not try to remove phony targets
    if (!e->is_phony()) {
      Remove(target->path());
      RemoveEdgeFiles(e);
    }
    for (vector<Node*>::iterator n = e->inputs_.begin(); n != e->inputs_.end();
         ++n) {
      Node* next = *n;
      // call DoCleanTarget recursively if this node has not been visited
      if (cleaned_.count(next) == 0) {
        DoCleanTarget(next);
      }
    }
  }

  // mark this target to be cleaned already
  cleaned_.insert(target);
}